

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void bumpActivity(saucy *s,sim_result *cex)

{
  double dVar1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  dVar1 = s->activityInc;
  dVar6 = cex->activity + dVar1;
  cex->activity = dVar6;
  if (1e+20 < dVar6) {
    lVar4 = (long)s->satCounterExamples->nSize;
    if (0 < lVar4) {
      ppvVar2 = s->satCounterExamples->pArray;
      lVar5 = 0;
      do {
        pvVar3 = ppvVar2[lVar5];
        *(double *)((long)pvVar3 + 0x18) = *(double *)((long)pvVar3 + 0x18) * 1e-20;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    s->activityInc = dVar1 * 1e-20;
  }
  return;
}

Assistant:

static void 
bumpActivity( struct saucy * s, struct sim_result * cex )
{
    int i;
    struct sim_result * cex2;

    if ( (cex->activity += s->activityInc) > 1e20 ) {
        /* Rescale: */
        for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
            cex2 = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
            cex2->activity *= 1e-20;
        }
        s->activityInc *= 1e-20; 
    } 
}